

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_binary_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_binary_read::BinBinaryReader::read_patch
          (BinBinaryReader *this,Hash *patchKeyHash,Embed *patch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *pos;
  char *pcVar2;
  char *pcVar3;
  BinCompat *pBVar4;
  ulong uVar5;
  Embed *pEVar6;
  bool bVar7;
  char cVar8;
  ssize_t sVar9;
  size_t in_RCX;
  char *__nbytes;
  char *extraout_RDX;
  char *pcVar10;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  string_view str;
  string_view str_00;
  Type type;
  String name;
  Type local_241;
  undefined1 *local_240;
  undefined8 local_238;
  undefined1 local_230;
  undefined7 uStack_22f;
  undefined8 uStack_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  FNV1a *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  FNV1a *local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  uint32_t local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  FNV1a *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  uint32_t local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  undefined8 local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  char *local_190;
  ulong local_188;
  Embed *local_180;
  Field local_178;
  _Variadic_union<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_108;
  undefined8 local_c8;
  _Variadic_union<ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_c0;
  undefined1 local_80;
  _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
  local_78;
  
  pcVar10 = (this->reader).cur_;
  sVar9 = BinaryReader::read(&this->reader,(int)patchKeyHash,patch,in_RCX);
  if ((char)sVar9 == '\0') {
    bVar7 = fail_msg(this,"reader.read(patchKeyHash.value)",pcVar10);
  }
  else {
    pos = (uint *)(this->reader).cur_;
    local_180 = patch;
    if ((this->reader).cap_ < pos + 1) {
      bVar7 = fail_msg(this,"reader.read(patchLength)",(char *)pos);
    }
    else {
      local_188 = (ulong)*pos;
      (this->reader).cur_ = (char *)(pos + 1);
      local_190 = (this->reader).beg_;
      pcVar2 = (this->reader).cur_;
      local_241 = NONE;
      local_240 = &local_230;
      local_238 = 0;
      local_230 = 0;
      local_c8 = 0;
      local_108._48_8_ = 0;
      local_108._56_8_ = 0;
      local_108._32_8_ = 0;
      local_108._40_8_ = 0;
      local_108._16_8_ = 0;
      local_108._24_8_ = 0;
      local_108._0_8_ = 0;
      local_108._8_8_ = 0;
      pcVar3 = (this->reader).cur_;
      __nbytes = (this->reader).cap_;
      pcVar10 = pcVar2 + 1;
      if (__nbytes < pcVar10) {
        cVar8 = '\0';
      }
      else {
        cVar8 = *pcVar2;
        (this->reader).cur_ = pcVar10;
        pBVar4 = (this->reader).compat_;
        __nbytes = *(char **)pBVar4;
        cVar8 = (**(code **)(__nbytes + 0x10))(pBVar4,cVar8,&local_241);
        pcVar10 = extraout_RDX;
      }
      if (cVar8 == '\0') {
        bVar7 = fail_msg(this,"reader.read(type)",pcVar3);
      }
      else {
        pcVar3 = (this->reader).cur_;
        sVar9 = BinaryReader::read(&this->reader,(int)&local_240,pcVar10,(size_t)__nbytes);
        uVar5 = local_188;
        if ((char)sVar9 == '\0') {
          bVar7 = fail_msg(this,"reader.read(name.value)",pcVar3);
        }
        else {
          pcVar10 = (this->reader).cur_;
          bVar7 = read_value_of(this,(Value *)&local_108,local_241);
          pEVar6 = local_180;
          if (bVar7) {
            if ((this->reader).cur_ + -(long)(this->reader).beg_ ==
                pcVar2 + (uVar5 - (long)local_190)) {
              local_200 = &local_1f0;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"path","");
              str._M_str = extraout_RDX_00;
              str._M_len = (size_t)local_200;
              local_1b8 = FNV1a::fnv1a(local_1f8,str);
              local_178.key.str_._M_string_length = (size_type)local_1f8;
              if (local_200 == &local_1f0) {
                local_1a0._8_8_ = local_1f0._8_8_;
                local_1b0 = &local_1a0;
              }
              else {
                local_1b0 = local_200;
              }
              local_1f8 = (FNV1a *)0x0;
              local_1f0._M_local_buf[0] = '\0';
              local_c0._0_8_ = (long)&local_c0 + 0x10;
              if (local_240 == &local_230) {
                local_c0._24_8_ = uStack_228;
              }
              else {
                local_c0._0_8_ = local_240;
              }
              local_c0._17_7_ = uStack_22f;
              local_c0._16_1_ = local_230;
              local_c0._8_8_ = local_238;
              local_238 = 0;
              local_230 = 0;
              local_80 = 0x10;
              paVar1 = &local_178.key.str_.field_2;
              if (local_1b0 == &local_1a0) {
                local_178.key.str_.field_2._8_8_ = local_1a0._8_8_;
                local_178.key.str_._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_178.key.str_._M_dataplus._M_p = (pointer)local_1b0;
              }
              local_1a8 = 0;
              local_1a0._M_allocated_capacity =
                   (ulong)(uint7)local_1f0._M_allocated_capacity._1_7_ << 8;
              local_240 = &local_230;
              local_200 = &local_1f0;
              local_1b0 = &local_1a0;
              local_178.key.hash_ = local_1b8;
              std::__detail::__variant::
              _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_178.value,
                                (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_c0);
              std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::
              emplace_back<ritobin::Field>(&pEVar6->items,&local_178);
              Field::~Field(&local_178);
              std::__detail::__variant::
              _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                   *)&local_c0);
              if (local_1b0 != &local_1a0) {
                operator_delete(local_1b0,local_1a0._M_allocated_capacity + 1);
              }
              if (local_200 != &local_1f0) {
                operator_delete(local_200,
                                CONCAT71(local_1f0._M_allocated_capacity._1_7_,
                                         local_1f0._M_local_buf[0]) + 1);
              }
              local_220 = &local_210;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"value","");
              str_00._M_str = extraout_RDX_01;
              str_00._M_len = (size_t)local_220;
              local_1e0 = FNV1a::fnv1a(local_218,str_00);
              if (local_220 == &local_210) {
                local_1c8._8_8_ = local_210._8_8_;
                local_1d8 = &local_1c8;
              }
              else {
                local_1d8 = local_220;
              }
              local_1c8._M_allocated_capacity =
                   (ulong)(uint7)local_210._M_allocated_capacity._1_7_ << 8;
              local_1d0 = local_218;
              local_218 = (FNV1a *)0x0;
              local_210._M_local_buf[0] = '\0';
              local_220 = &local_210;
              std::__detail::__variant::
              _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_78,
                                (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_108);
              local_178.key.hash_ = local_1e0;
              if (local_1d8 == &local_1c8) {
                local_178.key.str_.field_2._8_8_ = local_1c8._8_8_;
                local_178.key.str_._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_178.key.str_._M_dataplus._M_p = (pointer)local_1d8;
              }
              local_178.key.str_._M_string_length = (size_type)local_1d0;
              local_1d0 = (FNV1a *)0x0;
              local_1c8._M_allocated_capacity = local_1c8._M_allocated_capacity & 0xffffffffffffff00
              ;
              local_1d8 = &local_1c8;
              std::__detail::__variant::
              _Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::_Move_ctor_base((_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_178.value,
                                (_Move_ctor_base<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                                 *)&local_78);
              std::vector<ritobin::Field,_std::allocator<ritobin::Field>_>::
              emplace_back<ritobin::Field>(&pEVar6->items,&local_178);
              Field::~Field(&local_178);
              std::__detail::__variant::
              _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
              ::~_Variant_storage(&local_78);
              if (local_1d8 != &local_1c8) {
                operator_delete(local_1d8,local_1c8._M_allocated_capacity + 1);
              }
              if (local_220 != &local_210) {
                operator_delete(local_220,
                                CONCAT71(local_210._M_allocated_capacity._1_7_,
                                         local_210._M_local_buf[0]) + 1);
              }
              bVar7 = true;
            }
            else {
              bVar7 = fail_msg(this,"reader.position() == position + patchLength",
                               (this->reader).cur_);
            }
          }
          else {
            bVar7 = fail_msg(this,"read_value_of(value, type)",pcVar10);
          }
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
      ::~_Variant_storage((_Variant_storage<false,_ritobin::None,_ritobin::Bool,_ritobin::I8,_ritobin::U8,_ritobin::I16,_ritobin::U16,_ritobin::I32,_ritobin::U32,_ritobin::I64,_ritobin::U64,_ritobin::F32,_ritobin::Vec2,_ritobin::Vec3,_ritobin::Vec4,_ritobin::Mtx44,_ritobin::RGBA,_ritobin::String,_ritobin::Hash,_ritobin::File,_ritobin::List,_ritobin::List2,_ritobin::Pointer,_ritobin::Embed,_ritobin::Link,_ritobin::Option,_ritobin::Map,_ritobin::Flag>
                           *)&local_108);
      if (local_240 != &local_230) {
        operator_delete(local_240,CONCAT71(uStack_22f,local_230) + 1);
      }
    }
  }
  return bVar7;
}

Assistant:

bool read_patch(Hash& patchKeyHash, Embed& patch) {
            uint32_t patchLength = 0;
            bin_assert(reader.read(patchKeyHash.value));
            bin_assert(reader.read(patchLength));
            auto position = reader.position();
            Type type = {};
            String name = {};
            Value value = {};
            bin_assert(reader.read(type));
            bin_assert(reader.read(name.value));
            bin_assert(read_value_of(value, type));
            bin_assert(reader.position() == position + patchLength);
            patch.items.emplace_back(Field { {"path"}, std::move(name) });
            patch.items.emplace_back(Field { {"value"}, std::move(value) });
            return true;
        }